

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

void __thiscall
deqp::gls::StateChangeCallPerformanceCase::executeTest(StateChangeCallPerformanceCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  deUint64 dVar2;
  deUint64 dVar3;
  unsigned_long local_28;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  dVar2 = deGetMicroseconds();
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
            (this,CONCAT44(extraout_var,iVar1),
             (ulong)((long)(this->m_results).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(this->m_results).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3,(ulong)(uint)this->m_callCount);
  dVar3 = deGetMicroseconds();
  local_28 = dVar3 - dVar2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->m_results,&local_28);
  return;
}

Assistant:

void StateChangeCallPerformanceCase::executeTest (void)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	deUint64				beginTimeUs		= 0;
	deUint64				endTimeUs		= 0;

	beginTimeUs = deGetMicroseconds();

	execCalls(gl, (int)m_results.size(), m_callCount);

	endTimeUs = deGetMicroseconds();

	m_results.push_back(endTimeUs - beginTimeUs);
}